

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O2

bool __thiscall Neuron::tick(Neuron *this,float h)

{
  float fVar1;
  pointer pCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  byte bVar5;
  bool bVar6;
  size_t i_1;
  size_t i;
  ulong uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  
  fVar1 = this->m_prevMem;
  if (-40.0 < fVar1) {
    this->m_refractoryPeriod = true;
  }
  if (fVar1 <= 35.0) {
    fVar9 = prevMem(this);
    fVar10 = fVar9 * h + fVar1;
    this->m_curMem = fVar10;
    fVar9 = this->m_expireSpeedNotFired;
    this->m_curAdd = ((fVar1 + 60.0) * 0.5 - this->m_prevAdd) * 0.02 * h + this->m_prevAdd;
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      dVar13 = exp((double)(-h / fVar9));
      fVar10 = this->m_curMem;
      fVar9 = this->m_prevMem;
    }
    else {
      dVar13 = 1.0;
      fVar9 = fVar1;
    }
    this->m_synI = (float)((double)this->m_synI * dVar13);
    if ((-57.0 < fVar9) && (fVar10 <= -57.0)) {
      ppCVar3 = (this->m_incomingSpikes).
                super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar4 = (this->m_incomingSpikes).
                super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (lVar8 = 0; (long)ppCVar4 - (long)ppCVar3 >> 3 != lVar8; lVar8 = lVar8 + 1) {
        fVar10 = ppCVar3[lVar8]->m_weight;
        ppCVar3[lVar8]->m_weight = fVar10 + *(float *)(&DAT_001350f8 + (ulong)(fVar10 < 0.0) * 4);
      }
      if (ppCVar4 != ppCVar3) {
        (this->m_incomingSpikes).super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppCVar3;
      }
    }
    if (fVar9 <= -60.0) {
      this->m_firing = false;
      bVar5 = 0;
    }
    else {
      bVar5 = this->m_firing;
    }
    if (((bVar5 & 1) == 0) && (-60.0 < this->m_prevMem)) {
      this->m_refractoryPeriod = false;
    }
  }
  else {
    this->m_firing = true;
    this->m_curMem = -40.0;
    fVar9 = this->m_expireSpeedFired;
    this->m_curAdd = this->m_prevAdd + 100.0;
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      dVar13 = exp((double)(-h / fVar9));
      uVar11 = SUB84(dVar13,0);
      uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
    }
    else {
      uVar11 = 0;
      uVar12 = 0;
    }
    this->m_synI = (float)((double)this->m_synI * (double)CONCAT44(uVar12,uVar11));
    lVar8 = 0;
    for (uVar7 = 0;
        pCVar2 = (this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar7 < (ulong)(((long)(this->m_connections).
                               super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pCVar2) / 0x18);
        uVar7 = uVar7 + 1) {
      Connection::spike((Connection *)((long)&pCVar2->m_target + lVar8));
      lVar8 = lVar8 + 0x18;
    }
    ppCVar3 = (this->m_incomingSpikes).
              super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar4 = (this->m_incomingSpikes).
              super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (lVar8 = 0; (long)ppCVar4 - (long)ppCVar3 >> 3 != lVar8; lVar8 = lVar8 + 1) {
      fVar9 = ppCVar3[lVar8]->m_weight;
      ppCVar3[lVar8]->m_weight = fVar9 + *(float *)(&DAT_00135100 + (ulong)(fVar9 < 0.0) * 4);
    }
    if (ppCVar4 != ppCVar3) {
      (this->m_incomingSpikes).super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar3;
    }
  }
  this->m_prevMem = this->m_curMem;
  this->m_prevAdd = this->m_curAdd;
  if (this->m_refractoryPeriod == false) {
    bVar6 = watchForSpiked(this);
    if (bVar6) {
      this->m_prevMem = 35.1;
    }
  }
  return 35.0 < fVar1;
}

Assistant:

bool Neuron::tick(float h)
{
    bool fired = m_prevMem > kSpikeThreshold;
    if (m_prevMem > kMembraneAfterSpike)
        m_refractoryPeriod = true;

    if (fired) {
        m_firing = true;
        m_curMem = kMembraneAfterSpike;
        m_curAdd = m_prevAdd + 100.0f;
        m_synI *= m_expireSpeedFired ? exp(-h / m_expireSpeedFired) : 0;

        for (size_t i = 0; i < m_connections.size(); ++i)
            m_connections[i].spike();

        for (size_t i = 0; i < m_incomingSpikes.size(); ++i)
            m_incomingSpikes[i]->teach(1);

        m_incomingSpikes.clear();
    } else {
        m_curMem = m_prevMem + h * prevMem();
        m_curAdd = m_prevAdd + h * prevAdd();
        m_synI *= m_expireSpeedNotFired ? exp(-h / m_expireSpeedNotFired) : 1;

        // All prev spikes could not activate current neuron.
        // TODO: val should be param?
        const float activateThreshold = -57.0f;
        if (m_prevMem > activateThreshold && m_curMem <= activateThreshold) {
            for (size_t i = 0; i < m_incomingSpikes.size(); ++i)
                m_incomingSpikes[i]->teach(-1);

            m_incomingSpikes.clear();
        }

        if (m_prevMem <= kDefaultMembrane)
            m_firing = false;

        if (!m_firing && m_prevMem > kDefaultMembrane)
            m_refractoryPeriod = false;
    }

    m_prevMem = m_curMem;
    m_prevAdd = m_curAdd;

    if (!m_refractoryPeriod && watchForSpiked())
        spike();

    return fired;
}